

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall
level_tools::register_sector_item
          (level_tools *this,uint16_t sector_idx,char *scene_object,string *mesh)

{
  reference ppxVar1;
  sector_item_vec *psVar2;
  reference reference;
  sector_item *item;
  sector_item local_78;
  xr_sector_object *local_30;
  xr_sector_object *sector;
  string *mesh_local;
  char *scene_object_local;
  level_tools *plStack_10;
  uint16_t sector_idx_local;
  level_tools *this_local;
  
  sector = (xr_sector_object *)mesh;
  mesh_local = (string *)scene_object;
  scene_object_local._6_2_ = sector_idx;
  plStack_10 = this;
  ppxVar1 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
            at(this->m_scene_sectors,(ulong)sector_idx);
  local_30 = (xr_sector_object *)*ppxVar1;
  psVar2 = xray_re::xr_sector_object::items(local_30);
  local_78.mesh.field_2._M_allocated_capacity = 0;
  local_78.mesh.field_2._8_8_ = 0;
  local_78.mesh._M_dataplus = (_Alloc_hider)0x0;
  local_78.mesh._1_7_ = 0;
  local_78.mesh._M_string_length = 0;
  local_78.object.field_2._M_allocated_capacity = 0;
  local_78.object.field_2._8_8_ = 0;
  local_78.object._M_dataplus = (_Alloc_hider)0x0;
  local_78.object._1_7_ = 0;
  local_78.object._M_string_length = 0;
  xray_re::sector_item::sector_item(&local_78);
  std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::push_back
            (psVar2,&local_78);
  xray_re::sector_item::~sector_item(&local_78);
  psVar2 = xray_re::xr_sector_object::items(local_30);
  reference = std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::back(psVar2)
  ;
  make_object_ref(this,&reference->object,(char *)mesh_local);
  std::__cxx11::string::operator=((string *)&reference->mesh,(string *)sector);
  return;
}

Assistant:

void level_tools::register_sector_item(uint16_t sector_idx, const char* scene_object, std::string& mesh)
{
	xr_sector_object* sector = static_cast<xr_sector_object*>(m_scene_sectors->at(sector_idx));
	sector->items().push_back(sector_item());
	sector_item* item = &sector->items().back();
	make_object_ref(item->object, scene_object);
	item->mesh = mesh;
}